

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_once.h
# Opt level: O3

void absl::base_internal::CallOnceImpl<absl::base_internal::NominalCPUFrequency()::__0>
               (atomic<unsigned_int> *control,SchedulingMode scheduling_mode,
               anon_class_1_0_00000001 *fn)

{
  __int_type_conflict2 _Var1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  long lVar6;
  int *piVar7;
  int sleep_nanoseconds;
  int i;
  int iVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  TimeTscPair TVar12;
  TimeTscPair TVar13;
  char *err;
  char line [1024];
  char *local_440;
  timespec local_438 [64];
  
  _Var1 = (control->super___atomic_base<unsigned_int>)._M_i;
  if ((int)_Var1 < 0x5a308d2) {
    if ((_Var1 != 0) && (_Var1 != 0xdd)) {
LAB_001509e3:
      raw_logging_internal::RawLog
                (kFatal,"call_once.h",0x9e,"Unexpected value for control word: 0x%lx");
    }
  }
  else if ((_Var1 != 0x5a308d2) && (_Var1 != 0x65c2937b)) goto LAB_001509e3;
  LOCK();
  bVar9 = (control->super___atomic_base<unsigned_int>)._M_i == 0;
  if (bVar9) {
    (control->super___atomic_base<unsigned_int>)._M_i = 0x65c2937b;
  }
  UNLOCK();
  if ((!bVar9) &&
     (uVar2 = SpinLockWait(control,3,
                           CallOnceImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/base/internal/sysinfo.cc:362:7)>
                           ::trans,SCHEDULE_KERNEL_ONLY), uVar2 != 0)) {
    return;
  }
  iVar8 = 0;
  iVar3 = open("/sys/devices/system/cpu/cpu0/tsc_freq_khz",0);
  if (iVar3 != -1) {
    memset(local_438,0,0x400);
    sVar5 = read(iVar3,local_438,0x3ff);
    if (0 < (int)sVar5) {
      lVar6 = strtol((char *)local_438,&local_440,10);
      if (((char)local_438[0].tv_sec != '\0') && ((*local_440 == '\0' || (*local_440 == '\n')))) {
        close(iVar3);
        dVar10 = (double)lVar6 * 1000.0;
        goto LAB_00150b6a;
      }
    }
    close(iVar3);
  }
  iVar3 = 1000000;
  dVar11 = -1.0;
  do {
    TVar12 = GetTimeTscPair();
    local_438[0].tv_sec = 0;
    local_438[0].tv_nsec = (long)iVar3;
    do {
      iVar4 = nanosleep(local_438,local_438);
      if (iVar4 == 0) break;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    TVar13 = GetTimeTscPair();
    dVar10 = (double)(TVar13.tsc - TVar12.tsc) / ((double)(TVar13.time - TVar12.time) * 1e-09);
    if ((dVar10 * 0.99 < dVar11) && (dVar11 < dVar10 * 1.01)) break;
    iVar3 = iVar3 * 2;
    iVar8 = iVar8 + 1;
    dVar11 = dVar10;
  } while (iVar8 != 8);
LAB_00150b6a:
  LOCK();
  _Var1 = (control->super___atomic_base<unsigned_int>)._M_i;
  nominal_cpu_frequency = dVar10;
  (control->super___atomic_base<unsigned_int>)._M_i = 0xdd;
  UNLOCK();
  if (_Var1 == 0x5a308d2) {
    AbslInternalSpinLockWake(control,true);
  }
  return;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE
void CallOnceImpl(std::atomic<uint32_t>* control,
                  base_internal::SchedulingMode scheduling_mode, Callable&& fn,
                  Args&&... args) {
#ifndef NDEBUG
  {
    uint32_t old_control = control->load(std::memory_order_relaxed);
    if (old_control != kOnceInit &&
        old_control != kOnceRunning &&
        old_control != kOnceWaiter &&
        old_control != kOnceDone) {
      ABSL_RAW_LOG(FATAL, "Unexpected value for control word: 0x%lx",
                   static_cast<unsigned long>(old_control));  // NOLINT
    }
  }
#endif  // NDEBUG
  static const base_internal::SpinLockWaitTransition trans[] = {
      {kOnceInit, kOnceRunning, true},
      {kOnceRunning, kOnceWaiter, false},
      {kOnceDone, kOnceDone, true}};

  // Must do this before potentially modifying control word's state.
  base_internal::SchedulingHelper maybe_disable_scheduling(scheduling_mode);
  // Short circuit the simplest case to avoid procedure call overhead.
  // The base_internal::SpinLockWait() call returns either kOnceInit or
  // kOnceDone. If it returns kOnceDone, it must have loaded the control word
  // with std::memory_order_acquire and seen a value of kOnceDone.
  uint32_t old_control = kOnceInit;
  if (control->compare_exchange_strong(old_control, kOnceRunning,
                                       std::memory_order_relaxed) ||
      base_internal::SpinLockWait(control, ABSL_ARRAYSIZE(trans), trans,
                                  scheduling_mode) == kOnceInit) {
    base_internal::invoke(std::forward<Callable>(fn),
                          std::forward<Args>(args)...);
    old_control =
        control->exchange(base_internal::kOnceDone, std::memory_order_release);
    if (old_control == base_internal::kOnceWaiter) {
      base_internal::SpinLockWake(control, true);
    }
  }  // else *control is already kOnceDone
}